

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::String::FormatIntWidth2_abi_cxx11_
          (string *__return_storage_ptr__,String *this,int value)

{
  long lVar1;
  stringstream local_1a8 [8];
  stringstream ss;
  long local_198 [2];
  undefined8 auStack_188 [12];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  lVar1 = *(long *)(local_198[0] + -0x18);
  if (acStack_b8[lVar1 + 1] == '\0') {
    std::ios::widen((char)local_198 + (char)lVar1);
    acStack_b8[lVar1 + 1] = '\x01';
  }
  acStack_b8[lVar1] = '0';
  *(undefined8 *)((long)auStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  std::ostream::operator<<((ostream *)local_198,(int)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatIntWidth2(int value) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(2) << value;
  return ss.str();
}